

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<float>::TPZFileEqnStorage
          (TPZFileEqnStorage<float> *this,TPZFileEqnStorage<float> *param_1)

{
  uint in_EAX;
  int __fd;
  FILE *__s;
  uint uStack_38;
  int zero;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZFileEqnStorage_017b4390;
  uStack_38 = in_EAX;
  TPZStack<long,_10>::TPZStack(&this->fBlockPos);
  (this->fFileName)._M_dataplus._M_p = (pointer)&(this->fFileName).field_2;
  (this->fFileName)._M_string_length = 0;
  (this->fFileName).field_2._M_local_buf[0] = '\0';
  builtin_strncpy(filenamestorage + 0x10,"talXXXXXX",10);
  builtin_strncpy(filenamestorage,"/tmp/binary_fron",0x10);
  __fd = mkstemp(filenamestorage);
  this->fNumBlocks = 0;
  this->fCurrentBlock = 0;
  this->fCurBlockPosition = -1;
  this->fNumHeaders = 0x14;
  std::__cxx11::string::assign((char *)&this->fFileName);
  __s = fdopen(__fd,"wb");
  this->fIOStream = (FILE *)__s;
  _uStack_38 = (ulong)uStack_38;
  fwrite(&this->fNumHeaders,4,1,__s);
  fwrite(&zero,4,1,(FILE *)this->fIOStream);
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::TPZFileEqnStorage(const TPZFileEqnStorage &)
: TPZRegisterClassId(&TPZFileEqnStorage<TVar>::ClassId)
{
	strcpy(filenamestorage, "/tmp/binary_frontalXXXXXX");
#ifdef WIN32
	_mktemp(filenamestorage);
#else
	int fdtmp = -1;
	fdtmp = mkstemp(filenamestorage); //returns file description for tmp file
#endif
	
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	
	fFileName = filenamestorage;
#ifdef WIN32
	fIOStream = fopen(filenamestorage,"wb"); //open for writing
#else
	fIOStream = fdopen(fdtmp,"wb"); //open for writing
#endif
	/**
	 *Writes NumHeaders and NumBlocks information in
	 *the two initial positions on fIOStream
	 */
	int zero = 0;
	fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
	//cout << ftell(fIOStream) << endl;
	fwrite(&zero,sizeof(int),1,fIOStream);
}